

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O2

int libwebvtt::Parser::ParseSettings(string *line,size_type idx,settings_t *settings)

{
  char cVar1;
  _List_node_base *p_Var2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  Setting local_70;
  
  std::__cxx11::list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::clear(settings);
  iVar4 = -1;
  if ((idx != 0xffffffffffffffff) && (idx < line->_M_string_length)) {
    pcVar3 = (line->_M_dataplus)._M_p;
    while( true ) {
      local_70.value._M_dataplus._M_p = (pointer)&local_70.value.field_2;
      local_70.name._M_dataplus._M_p = (pointer)&local_70.name.field_2;
      sVar5 = idx;
      while( true ) {
        sVar5 = sVar5 + 1;
        cVar1 = pcVar3[idx];
        if ((cVar1 != '\t') && (cVar1 != ' ')) break;
        idx = idx + 1;
      }
      if (cVar1 == '\0') break;
      local_70.value.field_2._8_8_ = 0;
      local_70.value._M_string_length = 0;
      local_70.name.field_2._M_allocated_capacity = 0;
      local_70.name.field_2._8_8_ = 0;
      local_70.name._M_string_length = 0;
      local_70.value.field_2._M_allocated_capacity = 0;
      std::__cxx11::list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::push_back
                (settings,&local_70);
      Setting::~Setting(&local_70);
      p_Var2 = (settings->super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>)
               ._M_impl._M_node.super__List_node_base._M_prev;
      while( true ) {
        pcVar3 = (line->_M_dataplus)._M_p;
        cVar1 = pcVar3[idx];
        if (cVar1 == '\0') {
          return -1;
        }
        if (cVar1 == '\t') {
          return -1;
        }
        if (cVar1 == ' ') {
          return -1;
        }
        if (cVar1 == ':') break;
        std::__cxx11::string::push_back((char)p_Var2 + '\x10');
        idx = idx + 1;
        sVar5 = sVar5 + 1;
      }
      if (p_Var2[1]._M_prev == (_List_node_base *)0x0) {
        return -1;
      }
      while (((cVar1 = pcVar3[sVar5], cVar1 != '\0' && (cVar1 != '\t')) && (cVar1 != ' '))) {
        if (cVar1 == ':') {
          return -1;
        }
        std::__cxx11::string::push_back((char)p_Var2 + '0');
        sVar5 = sVar5 + 1;
        pcVar3 = (line->_M_dataplus)._M_p;
      }
      idx = sVar5;
      if (p_Var2[3]._M_prev == (_List_node_base *)0x0) {
        return -1;
      }
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Parser::ParseSettings(const std::string& line, std::string::size_type idx,
                          Cue::settings_t* settings) {
  settings->clear();

  if (idx == std::string::npos || idx >= line.length())
    return -1;

  for (;;) {
    // We must parse a line comprising a sequence of 0 or more
    // NAME:VALUE pairs, separated by whitespace.  The line iself is
    // terminated with a NUL char (indicating end-of-line).

    for (;;) {
      const char c = line[idx];

      if (c == kNUL)  // end-of-line
        return 0;  // success

      if (c != kSPACE && c != kTAB)
        break;

      ++idx;  // consume whitespace
    }

    // We have consumed the whitespace, and have not yet reached
    // end-of-line, so there is something on the line for us to parse.

    settings->push_back(Setting());
    Setting& s = settings->back();

    // Parse the NAME part of the settings pair.

    for (;;) {
      const char c = line[idx];

      if (c == ':')  // we have reached end of NAME part
        break;

      if (c == kNUL || c == kSPACE || c == kTAB)
        return -1;

      s.name.push_back(c);

      ++idx;
    }

    if (s.name.empty())
      return -1;

    ++idx;  // consume colon

    // Parse the VALUE part of the settings pair.

    for (;;) {
      const char c = line[idx];

      if (c == kNUL || c == kSPACE || c == kTAB)
        break;

      if (c == ':')  // suspicious when part of VALUE
        return -1;  // TODO(matthewjheaney): verify this behavior

      s.value.push_back(c);

      ++idx;
    }

    if (s.value.empty())
      return -1;
  }
}